

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void __thiscall
cppnet::SingletonLogger::SetLogger(SingletonLogger *this,shared_ptr<cppnet::Logger> *log)

{
  element_type *this_00;
  shared_ptr<cppnet::Logger> local_28;
  shared_ptr<cppnet::Logger> *local_18;
  shared_ptr<cppnet::Logger> *log_local;
  SingletonLogger *this_local;
  
  local_18 = log;
  log_local = (shared_ptr<cppnet::Logger> *)this;
  this_00 = std::__shared_ptr_access<cppnet::BaseLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cppnet::BaseLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->_logger);
  std::shared_ptr<cppnet::Logger>::shared_ptr(&local_28,log);
  BaseLogger::SetLogger(this_00,&local_28);
  std::shared_ptr<cppnet::Logger>::~shared_ptr(&local_28);
  return;
}

Assistant:

void SingletonLogger::SetLogger(std::shared_ptr<Logger> log) {
    _logger->SetLogger(log);
}